

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

MAFSA_automaton MAFSA_automaton_load_from_binary_memo(void *bmemo,int *error)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  undefined4 *in_RSI;
  uint *in_RDI;
  MAFSA_automaton ret_data;
  uint8_t *mem_p;
  uint32_t links_count;
  uint32_t nodes_count;
  MAFSA_automaton local_8;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  local_8 = (MAFSA_automaton)malloc(0x18);
  if (local_8 == (MAFSA_automaton)0x0) {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = 1;
    }
    local_8 = (MAFSA_automaton)0x0;
  }
  else {
    uVar1 = *in_RDI;
    uVar2 = in_RDI[1];
    puVar3 = (uint32_t *)malloc((ulong)uVar1 << 2);
    local_8->ptr_nodes = puVar3;
    if (local_8->ptr_nodes == (uint32_t *)0x0) {
      if (in_RSI != (undefined4 *)0x0) {
        *in_RSI = 1;
      }
      free(local_8);
      local_8 = (MAFSA_automaton)0x0;
    }
    else {
      memcpy(local_8->ptr_nodes,in_RDI + 2,(ulong)uVar1 << 2);
      puVar3 = (uint32_t *)malloc((ulong)uVar2 << 2);
      local_8->ptr_links = puVar3;
      if (local_8->ptr_links == (uint32_t *)0x0) {
        if (in_RSI != (undefined4 *)0x0) {
          *in_RSI = 1;
        }
        free(local_8->ptr_nodes);
        free(local_8);
        local_8 = (MAFSA_automaton)0x0;
      }
      else {
        memcpy(local_8->ptr_links,in_RDI + 2 + uVar1,(ulong)uVar2 << 2);
        local_8->shared = 0;
      }
    }
  }
  return local_8;
}

Assistant:

extern MAFSA_automaton MAFSA_automaton_load_from_binary_memo(const void *bmemo, int *error)
{
    uint32_t nodes_count;
    uint32_t links_count;

    const uint8_t *mem_p = (const uint8_t *) bmemo;
    MAFSA_automaton ret_data;

    if (error) *error = 0;

    ret_data = (MAFSA_automaton) malloc(sizeof(struct MAFSA_automaton_struct));

    if (0 == ret_data)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        return 0;
    }

    memcpy(&nodes_count, mem_p, sizeof(uint32_t));
    mem_p += sizeof(uint32_t);

    memcpy(&links_count, mem_p, sizeof(uint32_t));
    mem_p += sizeof(uint32_t);

    ret_data->ptr_nodes = (uint32_t *) malloc(nodes_count * sizeof(uint32_t));

    if (0 == ret_data->ptr_nodes)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        free(ret_data);
        return 0;
    }

    memcpy(ret_data->ptr_nodes, mem_p, sizeof(uint32_t) * nodes_count);
    mem_p += sizeof(uint32_t) * nodes_count;

    ret_data->ptr_links = (uint32_t*)malloc(links_count * sizeof(uint32_t));

    if (0 == ret_data->ptr_links)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        free(ret_data->ptr_nodes);
        free(ret_data);
        return 0;
    }

    memcpy(ret_data->ptr_links, mem_p, sizeof(uint32_t) * links_count);
    mem_p += sizeof(uint32_t) * links_count;

    ret_data->shared = 0;
    return ret_data;
}